

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O1

void CheckHash<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)42,(mp::expr::Kind)45>>
               (BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
                e)

{
  int iVar1;
  ulong uVar2;
  bool bVar3;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> expr;
  size_t sVar4;
  char *message;
  long lVar5;
  size_t hash;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  AssertHelper local_50;
  ulong local_48;
  hash<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_> local_40 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  local_48 = (long)*(int *)e.super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.super_ExprBase.
                           impl_ + 0x9e3779b9;
  iVar1 = *(int *)((long)e.super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.super_ExprBase.
                         impl_ + 4);
  if ((long)iVar1 != 0) {
    lVar5 = 0;
    do {
      uVar2 = local_48;
      expr = mp::internal::ExprBase::Create<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                       (*(Impl **)((long)e.super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.
                                         super_ExprBase.impl_ + 8 + lVar5));
      sVar4 = std::hash<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>::operator()
                        (local_40,(Expr)expr.super_ExprBase.impl_);
      local_48 = uVar2 * 0x40 + 0x9e3779b9 + (uVar2 >> 2) + sVar4 ^ uVar2;
      lVar5 = lVar5 + 8;
    } while ((long)iVar1 * 8 != lVar5);
  }
  local_58.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::hash<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>::operator()
                 ((hash<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_> *)&local_50,
                  (Expr)e.super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.super_ExprBase.
                        impl_);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_40,"hash","ExprHash()(e)",&local_48,(unsigned_long *)&local_58);
  if (local_40[0] == (hash<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_38.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x41f
               ,message);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_58.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_58.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_58.ptr_ + 8))();
      }
      local_58.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

void CheckHash(ExprType e) {
  size_t hash = HashCombine<int>(0, e.kind());
  for (typename ExprType::iterator i = e.begin(), end = e.end(); i != end; ++i)
    hash = HashCombine<Expr>(hash, *i);
  EXPECT_EQ(hash, ExprHash()(e));
}